

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi_loadf(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  float *pfVar1;
  stbi__context s;
  stbi__context local_100;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    stbi__g_failure_reason = "Unable to open file";
    pfVar1 = (float *)0x0;
  }
  else {
    stbi__start_callbacks(&local_100,&stbi__stdio_callbacks,__stream);
    pfVar1 = stbi__loadf_main(&local_100,x,y,comp,req_comp);
    fclose(__stream);
  }
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   float *result;
   FILE *f = stbi__fopen(filename, "rb");
   if (!f) return stbi__errpf("can't fopen", "Unable to open file");
   result = stbi_loadf_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}